

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cDirectStateAccessVertexArraysTests.cpp
# Opt level: O3

bool __thiscall
gl4cts::DirectStateAccess::VertexArrays::AttributeFormatTest::PrepareVAO<unsigned_char>
          (AttributeFormatTest *this,GLint size,GLenum type_gl_name,bool normalized,
          AtributeFormatFunctionType function_selector)

{
  ostringstream *this_00;
  GLuint GVar1;
  char cVar2;
  short sVar6;
  short sVar7;
  short sVar8;
  short sVar9;
  short sVar10;
  short sVar11;
  short sVar12;
  short sVar13;
  undefined1 auVar14 [16];
  undefined6 uVar15;
  undefined8 uVar16;
  unkbyte10 Var17;
  undefined1 auVar18 [12];
  undefined1 auVar19 [14];
  int iVar20;
  deUint32 dVar21;
  undefined4 uVar22;
  undefined4 extraout_var;
  char *pcVar24;
  size_t sVar25;
  undefined4 *puVar26;
  undefined7 in_register_00000009;
  char *pcVar27;
  code *pcVar28;
  double dVar29;
  char cVar30;
  char cVar31;
  char cVar32;
  int iVar33;
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  int iVar36;
  int iVar37;
  undefined1 local_1e8;
  undefined8 local_1e7;
  undefined4 local_1df;
  undefined1 local_1db;
  undefined1 local_1da;
  undefined1 local_1d9;
  Enum<int,_2UL> local_1d0;
  Enum<int,_2UL> local_1c0;
  undefined1 local_1b0 [120];
  ios_base local_138 [264];
  char cVar3;
  char cVar4;
  char cVar5;
  long lVar23;
  
  iVar20 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  lVar23 = CONCAT44(extraout_var,iVar20);
  (**(code **)(lVar23 + 0x708))(1,&this->m_vao);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glGenVertexArrays call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x872);
  (**(code **)(lVar23 + 0xd8))(this->m_vao);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glBindVertexArray call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x875);
  if ((int)CONCAT71(in_register_00000009,normalized) == 0) {
    dVar29 = 1.0;
  }
  else {
    dVar29 = 16.0;
  }
  local_1e8 = 0;
  iVar36 = (int)(dVar29 * 7.0);
  iVar37 = (int)(dVar29 * 8.0);
  iVar20 = (int)(dVar29 * 6.0);
  auVar34._0_4_ = (int)dVar29;
  auVar34._4_4_ = (int)(dVar29 + dVar29);
  auVar34._12_4_ = (int)(dVar29 * 4.0);
  auVar34._8_4_ = (int)(dVar29 * 3.0);
  auVar35[4] = (char)iVar20;
  auVar35._0_4_ = (int)(dVar29 * 5.0);
  auVar35[5] = (char)((uint)iVar20 >> 8);
  auVar35[6] = (char)((uint)iVar20 >> 0x10);
  auVar35[7] = (char)((uint)iVar20 >> 0x18);
  auVar35[8] = (char)iVar36;
  auVar35[9] = (char)((uint)iVar36 >> 8);
  auVar35[10] = (char)((uint)iVar36 >> 0x10);
  auVar35[0xb] = (char)((uint)iVar36 >> 0x18);
  auVar35[0xc] = (char)iVar37;
  auVar35[0xd] = (char)((uint)iVar37 >> 8);
  auVar35[0xe] = (char)((uint)iVar37 >> 0x10);
  auVar35[0xf] = (char)((uint)iVar37 >> 0x18);
  auVar35 = packssdw(auVar34,auVar35);
  sVar6 = auVar35._0_2_;
  sVar7 = auVar35._2_2_;
  sVar8 = auVar35._4_2_;
  sVar9 = auVar35._6_2_;
  sVar10 = auVar35._8_2_;
  sVar11 = auVar35._10_2_;
  sVar12 = auVar35._12_2_;
  sVar13 = auVar35._14_2_;
  local_1e7 = CONCAT17((0 < sVar13) * (sVar13 < 0x100) * auVar35[0xe] - (0xff < sVar13),
                       CONCAT16((0 < sVar12) * (sVar12 < 0x100) * auVar35[0xc] - (0xff < sVar12),
                                CONCAT15((0 < sVar11) * (sVar11 < 0x100) * auVar35[10] -
                                         (0xff < sVar11),
                                         CONCAT14((0 < sVar10) * (sVar10 < 0x100) * auVar35[8] -
                                                  (0xff < sVar10),
                                                  CONCAT13((0 < sVar9) * (sVar9 < 0x100) *
                                                           auVar35[6] - (0xff < sVar9),
                                                           CONCAT12((0 < sVar8) * (sVar8 < 0x100) *
                                                                    auVar35[4] - (0xff < sVar8),
                                                                    CONCAT11((0 < sVar7) *
                                                                             (sVar7 < 0x100) *
                                                                             auVar35[2] -
                                                                             (0xff < sVar7),
                                                                             (0 < sVar6) *
                                                                             (sVar6 < 0x100) *
                                                                             auVar35[0] -
                                                                             (0xff < sVar6))))))));
  iVar37 = (int)(dVar29 * 11.0);
  iVar33 = (int)(dVar29 * 12.0);
  iVar20 = (int)(dVar29 * 9.0);
  iVar36 = (int)(dVar29 * 10.0);
  cVar30 = (char)((uint)iVar36 >> 0x10);
  cVar31 = (char)((uint)iVar37 >> 0x10);
  cVar32 = (char)((uint)iVar33 >> 0x10);
  uVar15 = CONCAT15((char)((uint)iVar36 >> 8),CONCAT14((char)iVar36,iVar20));
  uVar16 = CONCAT17((char)((uint)iVar36 >> 0x18),CONCAT16(cVar30,uVar15));
  Var17 = CONCAT19((char)((uint)iVar37 >> 8),CONCAT18((char)iVar37,uVar16));
  auVar18[10] = cVar31;
  auVar18._0_10_ = Var17;
  auVar18[0xb] = (char)((uint)iVar37 >> 0x18);
  auVar19[0xc] = (char)iVar33;
  auVar19._0_12_ = auVar18;
  auVar19[0xd] = (char)((uint)iVar33 >> 8);
  auVar14[0xe] = cVar32;
  auVar14._0_14_ = auVar19;
  auVar14[0xf] = (char)((uint)iVar33 >> 0x18);
  sVar6 = (short)iVar20;
  cVar2 = (0 < sVar6) * (sVar6 < 0x100) * (char)iVar20 - (0xff < sVar6);
  sVar6 = (short)((uint)iVar20 >> 0x10);
  sVar7 = (short)((uint6)uVar15 >> 0x20);
  cVar3 = (0 < sVar7) * (sVar7 < 0x100) * (char)iVar36 - (0xff < sVar7);
  sVar7 = (short)((ulong)uVar16 >> 0x30);
  sVar8 = (short)((unkuint10)Var17 >> 0x40);
  cVar4 = (0 < sVar8) * (sVar8 < 0x100) * (char)iVar37 - (0xff < sVar8);
  sVar8 = auVar18._10_2_;
  sVar9 = auVar19._12_2_;
  cVar5 = (0 < sVar9) * (sVar9 < 0x100) * (char)iVar33 - (0xff < sVar9);
  sVar9 = auVar14._14_2_;
  sVar10 = CONCAT11((0 < sVar6) * (sVar6 < 0x100) * (char)((uint)iVar20 >> 0x10) - (0xff < sVar6),
                    cVar2);
  uVar22 = CONCAT13((0 < sVar7) * (sVar7 < 0x100) * cVar30 - (0xff < sVar7),CONCAT12(cVar3,sVar10));
  uVar15 = CONCAT15((0 < sVar8) * (sVar8 < 0x100) * cVar31 - (0xff < sVar8),CONCAT14(cVar4,uVar22));
  sVar6 = (short)((uint)uVar22 >> 0x10);
  sVar7 = (short)((uint6)uVar15 >> 0x20);
  sVar8 = (short)(CONCAT17((0 < sVar9) * (sVar9 < 0x100) * cVar32 - (0xff < sVar9),
                           CONCAT16(cVar5,uVar15)) >> 0x30);
  local_1df = CONCAT13((0 < sVar8) * (sVar8 < 0x100) * cVar5 - (0xff < sVar8),
                       CONCAT12((0 < sVar7) * (sVar7 < 0x100) * cVar4 - (0xff < sVar7),
                                CONCAT11((0 < sVar6) * (sVar6 < 0x100) * cVar3 - (0xff < sVar6),
                                         (0 < sVar10) * (sVar10 < 0x100) * cVar2 - (0xff < sVar10)))
                      );
  local_1db = (undefined1)(int)(dVar29 * 13.0);
  local_1da = (undefined1)(int)(dVar29 * 14.0);
  local_1d9 = (undefined1)(int)(dVar29 * 15.0);
  (**(code **)(lVar23 + 0x6c8))(1);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glGenBuffers call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x881);
  (**(code **)(lVar23 + 0x40))(0x8892,this->m_bo_array);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glBindBuffer call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x884);
  (**(code **)(lVar23 + 0x150))(0x8892,0x10,&local_1e8,0x88e4);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glBufferData call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x887);
  pcVar28 = *(code **)(lVar23 + 0x1898);
  uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po);
  (*pcVar28)(uVar22,0);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88b);
  pcVar28 = *(code **)(lVar23 + 0x1898);
  uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_1");
  (*pcVar28)(uVar22,1);
  dVar21 = (**(code **)(lVar23 + 0x800))();
  glu::checkError(dVar21,"glVertexAttribBinding call failed.",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                  ,0x88e);
  if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
    pcVar28 = *(code **)(lVar23 + 0x16b0);
    GVar1 = this->m_vao;
    uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_0");
    (*pcVar28)(GVar1,uVar22,size,type_gl_name,0);
    pcVar28 = *(code **)(lVar23 + 0x16b0);
  }
  else {
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
        puVar26 = (undefined4 *)__cxa_allocate_exception(4);
        *puVar26 = 0;
        __cxa_throw(puVar26,&int::typeinfo,0);
      }
      pcVar28 = *(code **)(lVar23 + 0x16a8);
      GVar1 = this->m_vao;
      uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_0");
      (*pcVar28)(GVar1,uVar22,size,type_gl_name,normalized,0);
      pcVar28 = *(code **)(lVar23 + 0x16a8);
      GVar1 = this->m_vao;
      uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_1");
      (*pcVar28)(GVar1,uVar22,size,type_gl_name,normalized,0);
      goto LAB_00ab3b06;
    }
    pcVar28 = *(code **)(lVar23 + 0x16b8);
    GVar1 = this->m_vao;
    uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_0");
    (*pcVar28)(GVar1,uVar22,size,type_gl_name,0);
    pcVar28 = *(code **)(lVar23 + 0x16b8);
  }
  GVar1 = this->m_vao;
  uVar22 = (**(code **)(lVar23 + 0x780))(this->m_po,"a_1");
  (*pcVar28)(GVar1,uVar22,size,type_gl_name,0);
LAB_00ab3b06:
  iVar20 = (**(code **)(lVar23 + 0x800))();
  if (iVar20 == 0) {
    (**(code **)(lVar23 + 0xe0))(0,this->m_bo_array,0,size * 2);
    (**(code **)(lVar23 + 0xe0))(1,this->m_bo_array,size,size * 2);
    dVar21 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar21,"glBufferData call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8be);
    (**(code **)(lVar23 + 0x610))(0);
    dVar21 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar21,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c1);
    (**(code **)(lVar23 + 0x610))(1);
    dVar21 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar21,"glEnableVertexAttribArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c4);
    (**(code **)(lVar23 + 0xd8))(0);
    dVar21 = (**(code **)(lVar23 + 0x800))();
    glu::checkError(dVar21,"glBindVertexArray call failed.",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/openglcts/modules/gl/gl4cDirectStateAccessVertexArraysTests.cpp"
                    ,0x8c7);
  }
  else {
    local_1b0._0_8_ = ((this->super_TestCase).m_context)->m_testCtx->m_log;
    this_00 = (ostringstream *)(local_1b0 + 8);
    std::__cxx11::ostringstream::ostringstream(this_00);
    pcVar27 = "VertexArrayAttrib?Format";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_INTEGER) {
      pcVar27 = "VertexArrayAttribIFormat";
    }
    pcVar24 = "VertexArrayAttribLFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_DOUBLE) {
      pcVar24 = pcVar27;
    }
    pcVar27 = "VertexArrayAttribFormat";
    if (function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar27 = pcVar24;
    }
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,pcVar27,
               (ulong)(function_selector != ATTRIBUTE_FORMAT_FUNCTION_FLOAT) + 0x17);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00," has unexpectedly generated ",0x1c);
    local_1c0.m_getName = glu::getErrorName;
    local_1c0.m_value = iVar20;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1c0,(ostream *)this_00);
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)this_00,"error for test with size = ",0x1b);
    std::ostream::operator<<(this_00,size);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", type = ",9);
    local_1d0.m_getName = glu::getTypeName;
    local_1d0.m_value = type_gl_name;
    tcu::Format::Enum<int,_2UL>::toStream(&local_1d0,(ostream *)this_00);
    pcVar27 = ", which was not normalized.";
    if (normalized) {
      pcVar27 = ", which was normalized.";
    }
    pcVar24 = ".";
    if (function_selector == ATTRIBUTE_FORMAT_FUNCTION_FLOAT) {
      pcVar24 = pcVar27;
    }
    sVar25 = strlen(pcVar24);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,pcVar24,sVar25);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," Test fails.\n",0xd);
    tcu::MessageBuilder::operator<<
              ((MessageBuilder *)local_1b0,(EndMessageToken *)&tcu::TestLog::EndMessage);
    std::__cxx11::ostringstream::~ostringstream(this_00);
    std::ios_base::~ios_base(local_138);
  }
  return iVar20 == 0;
}

Assistant:

bool AttributeFormatTest::PrepareVAO(glw::GLint size, glw::GLenum type_gl_name, bool normalized,
									 AtributeFormatFunctionType function_selector)
{
	/* Shortcut for GL functionality */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	/* VAO creation. */
	gl.genVertexArrays(1, &m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenVertexArrays call failed.");

	gl.bindVertexArray(m_vao);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	/* Array buffer 0 creation. */

	const glw::GLdouble scale = normalized ? NormalizationScaleFactor<T>() : 1.0;

	const T array_data[16] = { (T)(0.0 * scale),  (T)(1.0 * scale),  (T)(2.0 * scale),  (T)(3.0 * scale),
							   (T)(4.0 * scale),  (T)(5.0 * scale),  (T)(6.0 * scale),  (T)(7.0 * scale),
							   (T)(8.0 * scale),  (T)(9.0 * scale),  (T)(10.0 * scale), (T)(11.0 * scale),
							   (T)(12.0 * scale), (T)(13.0 * scale), (T)(14.0 * scale), (T)(15.0 * scale) };

	gl.genBuffers(1, &m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glGenBuffers call failed.");

	gl.bindBuffer(GL_ARRAY_BUFFER, m_bo_array);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindBuffer call failed.");

	gl.bufferData(GL_ARRAY_BUFFER, sizeof(array_data), array_data, GL_STATIC_DRAW);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	/* Attribute setup. */
	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_0"), 0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	gl.vertexAttribBinding(gl.getAttribLocation(m_po, "a_1"), 1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glVertexAttribBinding call failed.");

	/* Tested attribute format setup. */
	switch (function_selector)
	{
	case ATTRIBUTE_FORMAT_FUNCTION_FLOAT:
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, normalized, 0);
		gl.vertexArrayAttribFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, normalized, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_DOUBLE:
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribLFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;

	case ATTRIBUTE_FORMAT_FUNCTION_INTEGER:
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_0"), size, type_gl_name, 0);
		gl.vertexArrayAttribIFormat(m_vao, gl.getAttribLocation(m_po, "a_1"), size, type_gl_name, 0);
		break;
	default:
		throw 0;
	}

	if (glw::GLenum error = gl.getError())
	{
		m_context.getTestContext().getLog()
			<< tcu::TestLog::Message
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					"VertexArrayAttribFormat" :
					((ATTRIBUTE_FORMAT_FUNCTION_DOUBLE == function_selector) ?
						 "VertexArrayAttribLFormat" :
						 ((ATTRIBUTE_FORMAT_FUNCTION_INTEGER == function_selector) ? "VertexArrayAttribIFormat" :
																					 "VertexArrayAttrib?Format")))
			<< " has unexpectedly generated " << glu::getErrorStr(error) << "error for test with size = " << size
			<< ", type = " << glu::getTypeStr(type_gl_name)
			<< ((ATTRIBUTE_FORMAT_FUNCTION_FLOAT == function_selector) ?
					(normalized ? ", which was normalized." : ", which was not normalized.") :
					".")
			<< " Test fails.\n"
			<< tcu::TestLog::EndMessage;

		return false;
	}

	gl.bindVertexBuffer(0, m_bo_array, 0, static_cast<glw::GLsizei>(sizeof(T) * size * 2));
	gl.bindVertexBuffer(1, m_bo_array, (glw::GLintptr)((T*)NULL + size),
						static_cast<glw::GLsizei>(sizeof(T) * size * 2));

	GLU_EXPECT_NO_ERROR(gl.getError(), "glBufferData call failed.");

	gl.enableVertexAttribArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.enableVertexAttribArray(1);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glEnableVertexAttribArray call failed.");

	gl.bindVertexArray(0);
	GLU_EXPECT_NO_ERROR(gl.getError(), "glBindVertexArray call failed.");

	return true;
}